

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::objectivec::HandleExtremeFloatingPoint
                   (string *__return_storage_ptr__,string *val,bool add_float_suffix)

{
  bool bVar1;
  long lVar2;
  allocator *paVar3;
  char *pcVar4;
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  
  bVar1 = std::operator==(val,"nan");
  if (bVar1) {
    pcVar4 = "NAN";
    paVar3 = &local_19;
  }
  else {
    bVar1 = std::operator==(val,"inf");
    if (bVar1) {
      pcVar4 = "INFINITY";
      paVar3 = &local_1a;
    }
    else {
      bVar1 = std::operator==(val,"-inf");
      if (!bVar1) {
        if ((add_float_suffix) &&
           (((lVar2 = std::__cxx11::string::find((char *)val,0x34f683), lVar2 != -1 ||
             (lVar2 = std::__cxx11::string::find((char *)val,0x34a884), lVar2 != -1)) ||
            (lVar2 = std::__cxx11::string::find((char *)val,0x3a4990), lVar2 != -1)))) {
          std::__cxx11::string::append((char *)val);
        }
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)val);
        return __return_storage_ptr__;
      }
      pcVar4 = "-INFINITY";
      paVar3 = &local_1b;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,paVar3);
  return __return_storage_ptr__;
}

Assistant:

static string HandleExtremeFloatingPoint(string val, bool add_float_suffix) {
  if (val == "nan") {
    return "NAN";
  } else if (val == "inf") {
    return "INFINITY";
  } else if (val == "-inf") {
    return "-INFINITY";
  } else {
    // float strings with ., e or E need to have f appended
    if (add_float_suffix &&
        (val.find(".") != string::npos || val.find("e") != string::npos ||
         val.find("E") != string::npos)) {
      val += "f";
    }
    return val;
  }
}